

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsItem::setOpacity(QGraphicsItem *this,qreal opacity)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  long in_FS_OFFSET;
  double dVar3;
  double dVar4;
  QVariant local_88;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 uStack_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)&local_68,opacity);
  (*this->_vptr_QGraphicsItem[0x21])(&local_48,this,0x19,&local_68);
  ::QVariant::~QVariant((QVariant *)&local_68);
  dVar3 = (double)::QVariant::toReal((bool *)local_48.data);
  bVar1 = 1.0 < dVar3;
  if (dVar3 <= 0.0) {
    dVar3 = 0.0;
  }
  dVar4 = (double)(-(ulong)bVar1 & 0x3ff0000000000000 | ~-(ulong)bVar1 & (ulong)dVar3);
  pQVar2 = (this->d_ptr).d;
  dVar3 = pQVar2->opacity;
  if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
    pQVar2->opacity = dVar4;
    (*this->_vptr_QGraphicsItem[0x21])(&local_88,this,0x1a);
    ::QVariant::~QVariant(&local_88);
    pQVar2 = (this->d_ptr).d;
    if (pQVar2->scene != (QGraphicsScene *)0x0) {
      QGraphicsItemPrivate::invalidateParentGraphicsEffectsRecursively(pQVar2);
      pQVar2 = (this->d_ptr).d;
      if ((pQVar2->field_0x164 & 0x80) == 0) {
        QGraphicsItemPrivate::invalidateChildGraphicsEffectsRecursively(pQVar2,OpacityChanged);
        pQVar2 = (this->d_ptr).d;
      }
      local_68._16_8_ = 0;
      uStack_50 = 0;
      local_68.shared = (PrivateShared *)0x0;
      local_68._8_8_ = 0;
      QGraphicsScenePrivate::markDirty
                (*(QGraphicsScenePrivate **)&pQVar2->scene->field_0x8,this,(QRectF *)&local_68,true,
                 false,pQVar2->opacity <= 0.001 && pQVar2->opacity != 0.001,false,false);
      pQVar2 = (this->d_ptr).d;
      if (dVar3 < 0.001) {
        pQVar2->field_0x166 = pQVar2->field_0x166 | 0x10;
        pQVar2 = (this->d_ptr).d;
      }
    }
    if ((pQVar2->field_0x167 & 1) != 0) {
      QMetaObject::activate
                ((QObject *)(this + -1),&QGraphicsObject::staticMetaObject,1,(void **)0x0);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setOpacity(qreal opacity)
{
    // Notify change.
    const QVariant newOpacityVariant(itemChange(ItemOpacityChange, opacity));

    // Normalized opacity
    qreal newOpacity = qBound(qreal(0), newOpacityVariant.toReal(), qreal(1));

    // No change? Done.
    if (newOpacity == d_ptr->opacity)
        return;

    bool wasFullyTransparent = d_ptr->isOpacityNull();
    d_ptr->opacity = newOpacity;

    // Notify change.
    itemChange(ItemOpacityHasChanged, newOpacityVariant);

    // Update.
    if (d_ptr->scene) {
#if QT_CONFIG(graphicseffect)
        d_ptr->invalidateParentGraphicsEffectsRecursively();
        if (!(d_ptr->flags & ItemDoesntPropagateOpacityToChildren))
            d_ptr->invalidateChildGraphicsEffectsRecursively(QGraphicsItemPrivate::OpacityChanged);
#endif // QT_CONFIG(graphicseffect)
        d_ptr->scene->d_func()->markDirty(this, QRectF(),
                                          /*invalidateChildren=*/true,
                                          /*force=*/false,
                                          /*ignoreOpacity=*/d_ptr->isOpacityNull());
        if (wasFullyTransparent)
            d_ptr->paintedViewBoundingRectsNeedRepaint = 1;
    }

    if (d_ptr->isObject)
        emit static_cast<QGraphicsObject *>(this)->opacityChanged();
}